

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeTableMoveto(BtCursor *pCur,i64 intKey,int biasRight,int *pRes)

{
  byte *p;
  undefined4 *in_RCX;
  char in_DL;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  u8 *pCell;
  MemPage *pPage;
  Pgno chldPg;
  int c;
  int idx;
  int upr;
  int lwr;
  int rc;
  i64 nCellKey;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  byte *pbVar1;
  BtCursor *in_stack_ffffffffffffffa8;
  long lVar2;
  undefined4 local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_14;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*in_RDI == '\0') && ((in_RDI[1] & 2U) != 0)) {
    if (*(long *)(in_RDI + 0x30) == in_RSI) {
      *in_RCX = 0;
      local_14 = 0;
      goto LAB_001866fa;
    }
    if (*(long *)(in_RDI + 0x30) < in_RSI) {
      if ((in_RDI[1] & 8U) != 0) {
        *in_RCX = 0xffffffff;
        local_14 = 0;
        goto LAB_001866fa;
      }
      if (*(long *)(in_RDI + 0x30) + 1 == in_RSI) {
        *in_RCX = 0;
        local_14 = sqlite3BtreeNext(in_stack_ffffffffffffffa8,
                                    (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
        if (local_14 == 0) {
          getCellInfo((BtCursor *)0x186368);
          if (*(long *)(in_RDI + 0x30) == in_RSI) {
            local_14 = 0;
            goto LAB_001866fa;
          }
        }
        else if (local_14 != 0x65) goto LAB_001866fa;
      }
    }
  }
  local_14 = moveToRoot(in_stack_ffffffffffffffa8);
  if (local_14 == 0) {
LAB_001863e6:
    lVar2 = *(long *)(in_RDI + 0x88);
    local_40 = 0;
    local_44 = *(ushort *)(lVar2 + 0x18) - 1;
    local_48 = local_44 >> (1U - in_DL & 0x1f);
    do {
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      p = (byte *)(*(long *)(lVar2 + 0x68) +
                  (long)(int)(uint)(*(ushort *)(lVar2 + 0x1a) &
                                   CONCAT11(*(undefined1 *)
                                             (*(long *)(lVar2 + 0x60) + (long)(local_48 << 1)),
                                            *(undefined1 *)
                                             (*(long *)(lVar2 + 0x60) + 1 + (long)(local_48 << 1))))
                  );
      pbVar1 = p;
      if (*(char *)(lVar2 + 2) != '\0') {
        while (p = pbVar1 + 1, 0x7f < *pbVar1) {
          pbVar1 = p;
          if (*(byte **)(lVar2 + 0x58) <= p) {
            local_14 = sqlite3CorruptError(0);
            goto LAB_001866fa;
          }
        }
      }
      sqlite3GetVarint(p,(u64 *)&local_10);
      if ((long)local_10 < in_RSI) {
        local_40 = local_48 + 1;
        if (local_44 < local_40) {
          local_4c = 0xffffffff;
          goto LAB_001865f6;
        }
      }
      else {
        if ((long)local_10 <= in_RSI) {
          *(short *)(in_RDI + 0x56) = (short)local_48;
          if (*(char *)(lVar2 + 8) != '\0') {
            in_RDI[1] = in_RDI[1] | 2;
            *(undefined1 **)(in_RDI + 0x30) = local_10;
            in_RDI[0x46] = '\0';
            in_RDI[0x47] = '\0';
            *in_RCX = 0;
            local_14 = 0;
            goto LAB_001866fa;
          }
          local_40 = local_48;
          goto LAB_0018662b;
        }
        local_44 = local_48 + -1;
        if (local_44 < local_40) goto code_r0x0018656d;
      }
      local_48 = local_40 + local_44 >> 1;
    } while( true );
  }
  if (local_14 == 0x10) {
    *in_RCX = 0xffffffff;
    local_14 = 0;
  }
LAB_001866fa:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_14;
code_r0x0018656d:
  local_4c = 1;
LAB_001865f6:
  if (*(char *)(lVar2 + 8) != '\0') {
    *(short *)(in_RDI + 0x56) = (short)local_48;
    *in_RCX = local_4c;
    local_3c = 0;
    goto LAB_001866e7;
  }
LAB_0018662b:
  if (local_40 < (int)(uint)*(ushort *)(lVar2 + 0x18)) {
    sqlite3Get4byte((u8 *)(*(long *)(lVar2 + 0x50) +
                          (long)(int)(uint)(*(ushort *)(lVar2 + 0x1a) &
                                           CONCAT11(*(undefined1 *)
                                                     (*(long *)(lVar2 + 0x60) +
                                                     (long)(local_40 << 1)),
                                                    *(undefined1 *)
                                                     (*(long *)(lVar2 + 0x60) + 1 +
                                                     (long)(local_40 << 1))))));
  }
  else {
    sqlite3Get4byte((u8 *)(*(long *)(lVar2 + 0x50) + (long)(int)(*(byte *)(lVar2 + 9) + 8)));
  }
  *(short *)(in_RDI + 0x56) = (short)local_40;
  local_3c = moveToChild((BtCursor *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0
                        );
  if (local_3c != 0) goto LAB_001866e7;
  goto LAB_001863e6;
LAB_001866e7:
  in_RDI[0x46] = '\0';
  in_RDI[0x47] = '\0';
  local_14 = local_3c;
  goto LAB_001866fa;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeTableMoveto(
  BtCursor *pCur,          /* The cursor to be moved */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( pCur->pKeyInfo==0 );
  assert( pCur->eState!=CURSOR_VALID || pCur->curIntKey!=0 );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pCur->eState==CURSOR_VALID && (pCur->curFlags & BTCF_ValidNKey)!=0 ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->info.nKey<intKey ){
      if( (pCur->curFlags & BTCF_AtLast)!=0 ){
        assert( cursorIsAtLastEntry(pCur) || CORRUPT_DB );
        *pRes = -1;
        return SQLITE_OK;
      }
      /* If the requested key is one more than the previous key, then
      ** try to get there using sqlite3BtreeNext() rather than a full
      ** binary search.  This is an optimization only.  The correct answer
      ** is still obtained without this case, only a little more slowly. */
      if( pCur->info.nKey+1==intKey ){
        *pRes = 0;
        rc = sqlite3BtreeNext(pCur, 0);
        if( rc==SQLITE_OK ){
          getCellInfo(pCur);
          if( pCur->info.nKey==intKey ){
            return SQLITE_OK;
          }
        }else if( rc!=SQLITE_DONE ){
          return rc;
        }
      }
    }
  }

#ifdef SQLITE_DEBUG
  pCur->pBtree->nSeek++;   /* Performance measurement during testing */
#endif

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->iPage==0 || pCur->apPage[0]->intKey==pCur->curIntKey );
  assert( pCur->curIntKey );

  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey );
    lwr = 0;
    upr = pPage->nCell-1;
    assert( biasRight==0 || biasRight==1 );
    idx = upr>>(1-biasRight); /* idx = biasRight ? upr : (lwr+upr)/2; */
    for(;;){
      i64 nCellKey;
      pCell = findCellPastPtr(pPage, idx);
      if( pPage->intKeyLeaf ){
        while( 0x80 <= *(pCell++) ){
          if( pCell>=pPage->aDataEnd ){
            return SQLITE_CORRUPT_PAGE(pPage);
          }
        }
      }
      getVarint(pCell, (u64*)&nCellKey);
      if( nCellKey<intKey ){
        lwr = idx+1;
        if( lwr>upr ){ c = -1; break; }
      }else if( nCellKey>intKey ){
        upr = idx-1;
        if( lwr>upr ){ c = +1; break; }
      }else{
        assert( nCellKey==intKey );
        pCur->ix = (u16)idx;
        if( !pPage->leaf ){
          lwr = idx;
          goto moveto_table_next_layer;
        }else{
          pCur->curFlags |= BTCF_ValidNKey;
          pCur->info.nKey = nCellKey;
          pCur->info.nSize = 0;
          *pRes = 0;
          return SQLITE_OK;
        }
      }
      assert( lwr+upr>=0 );
      idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2; */
    }
    assert( lwr==upr+1 || !pPage->leaf );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_table_finish;
    }
moveto_table_next_layer:
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->ix = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_table_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}